

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O3

string * testing::internal::UnitTestOptions::GetAbsolutePathToOutputFile_abi_cxx11_(void)

{
  char *__s;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined1 *puVar2;
  string *psVar3;
  char *pcVar4;
  size_t sVar5;
  string *in_RDI;
  FilePath result;
  FilePath output_name;
  allocator local_e1;
  string local_e0;
  string local_c0;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  if (FLAGS_gtest_output_abi_cxx11_ == (char *)0x0) {
    (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
    std::__cxx11::string::_M_construct<char_const*>();
  }
  else {
    pcVar4 = strchr(FLAGS_gtest_output_abi_cxx11_,0x3a);
    if (pcVar4 == (char *)0x0) {
      UnitTest::GetInstance();
      std::__cxx11::string::string
                ((string *)&local_80,
                 ((UnitTest::GetInstance::instance.impl_)->original_working_dir_).pathname_.
                 _M_dataplus._M_p,(allocator *)&local_40);
      FilePath::FilePath((FilePath *)&local_e0,&local_80);
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"test_detail.xml","");
      FilePath::FilePath((FilePath *)&local_a0,&local_60);
      FilePath::ConcatPaths((FilePath *)&local_c0,(FilePath *)&local_e0,(FilePath *)&local_a0);
      (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
      std::__cxx11::string::_M_construct<char*>();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
        operator_delete(local_e0._M_dataplus._M_p);
      }
      psVar3 = &local_80;
    }
    else {
      __s = pcVar4 + 1;
      paVar1 = &local_e0.field_2;
      local_e0._M_dataplus._M_p = (pointer)paVar1;
      sVar5 = strlen(__s);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,__s,pcVar4 + sVar5 + 1);
      FilePath::FilePath((FilePath *)&local_c0,&local_e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != paVar1) {
        operator_delete(local_e0._M_dataplus._M_p);
      }
      if (*local_c0._M_dataplus._M_p != '/') {
        UnitTest::GetInstance();
        std::__cxx11::string::string
                  ((string *)&local_a0,
                   ((UnitTest::GetInstance::instance.impl_)->original_working_dir_).pathname_.
                   _M_dataplus._M_p,&local_e1);
        FilePath::FilePath((FilePath *)&local_80,&local_a0);
        local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
        sVar5 = strlen(__s);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,__s,__s + sVar5);
        FilePath::FilePath((FilePath *)&local_60,&local_40);
        FilePath::ConcatPaths((FilePath *)&local_e0,(FilePath *)&local_80,(FilePath *)&local_60);
        std::__cxx11::string::_M_assign((string *)&local_c0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != paVar1) {
          operator_delete(local_e0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) {
          operator_delete(local_60._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_40._M_dataplus._M_p != &local_40.field_2) {
          operator_delete(local_40._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
          operator_delete(local_a0._M_dataplus._M_p);
        }
      }
      if ((local_c0._M_string_length == 0) ||
         (local_c0._M_dataplus._M_p[local_c0._M_string_length - 1] != '/')) {
        (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
        std::__cxx11::string::_M_construct<char*>();
      }
      else {
        GetCurrentExecutableName();
        GetOutputFormat_abi_cxx11_();
        FilePath::GenerateUniqueFileName
                  ((FilePath *)&local_e0,(FilePath *)&local_c0,(FilePath *)&local_80,
                   local_a0._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
          operator_delete(local_a0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p);
        }
        (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
        std::__cxx11::string::_M_construct<char*>();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != paVar1) {
          operator_delete(local_e0._M_dataplus._M_p);
        }
      }
      psVar3 = &local_c0;
    }
    puVar2 = *(undefined1 **)((psVar3->field_2)._M_local_buf + -0x10);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar2 != &psVar3->field_2) {
      operator_delete(puVar2);
    }
  }
  return in_RDI;
}

Assistant:

std::string UnitTestOptions::GetAbsolutePathToOutputFile() {
  const char* const gtest_output_flag = GTEST_FLAG(output).c_str();
  if (gtest_output_flag == NULL)
    return "";

  const char* const colon = strchr(gtest_output_flag, ':');
  if (colon == NULL)
    return internal::FilePath::ConcatPaths(
        internal::FilePath(
            UnitTest::GetInstance()->original_working_dir()),
        internal::FilePath(kDefaultOutputFile)).string();

  internal::FilePath output_name(colon + 1);
  if (!output_name.IsAbsolutePath())
    // TODO(wan@google.com): on Windows \some\path is not an absolute
    // path (as its meaning depends on the current drive), yet the
    // following logic for turning it into an absolute path is wrong.
    // Fix it.
    output_name = internal::FilePath::ConcatPaths(
        internal::FilePath(UnitTest::GetInstance()->original_working_dir()),
        internal::FilePath(colon + 1));

  if (!output_name.IsDirectory())
    return output_name.string();

  internal::FilePath result(internal::FilePath::GenerateUniqueFileName(
      output_name, internal::GetCurrentExecutableName(),
      GetOutputFormat().c_str()));
  return result.string();
}